

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O2

void __thiscall
covenant::CFG::get_stats(CFG *this,uint *terminals,uint *nonterminals,uint *productions)

{
  pointer pvVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  *terminals = this->alphsz;
  pvVar1 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->prods).
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
  *nonterminals = (uint)uVar2;
  *productions = 0;
  uVar3 = 0;
  for (uVar4 = 0; uVar5 = (ulong)uVar4, uVar5 < uVar2; uVar4 = uVar4 + 1) {
    uVar3 = uVar3 + (int)((ulong)((long)*(pointer *)
                                         ((long)&pvVar1[uVar5].
                                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&pvVar1[uVar5].
                                           super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                           ._M_impl.super__Vector_impl_data) >> 2);
    *productions = uVar3;
  }
  return;
}

Assistant:

void get_stats(unsigned& terminals,
                   unsigned& nonterminals,
                   unsigned& productions) const
    {
      terminals = alphsz;
      nonterminals = prods.size ();
      productions = 0;
      for ( unsigned vv = 0; vv < prods.size(); ++vv)
        productions += prods[vv].size();
    }